

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O0

void __thiscall Atari2600::TIA::set_player_position(TIA *this,int player)

{
  bool local_15;
  int player_local;
  TIA *this_local;
  
  local_15 = 1 < (uint)player;
  if (local_15) {
    __assert_fail("player >= 0 && player < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/2600/TIA.cpp"
                  ,0x132,"void Atari2600::TIA::set_player_position(int)");
  }
  this->player_[player].super_Object<Atari2600::TIA::Player>.position = -1;
  return;
}

Assistant:

void TIA::set_player_position(int player) {
	assert(player >= 0 && player < 2);
	// players have an extra clock of delay before output and don't display upon reset;
	// both aims are achieved by setting to -1 because: (i) it causes the clock to be
	// one behind its real hardware value, creating the extra delay; and (ii) the player
	// code is written to start a draw upon wraparound from 159 to 0, so -1 is the
	// correct option rather than 159.
	player_[player].position = -1;
}